

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# big_integer_testing.cpp
# Opt level: O2

void __thiscall
correctness_div_randomized_Test::correctness_div_randomized_Test
          (correctness_div_randomized_Test *this)

{
  testing::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__Test_00150380;
  return;
}

Assistant:

TEST(correctness, div_randomized)
{
    for (size_t itn = 0; itn != number_of_iterations * number_of_multipliers; ++itn)
    {
        big_integer divident = rand_big(10);
        big_integer divisor = rand_big(6);
        big_integer quotient = divident / divisor;
        big_integer residue = divident % divisor;
        ASSERT_EQ(divident - quotient * divisor, residue);
        EXPECT_GE(residue, 0);
        EXPECT_LT(residue, divisor);
    }
}